

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

arrayMoveList * __thiscall
game::generateLegalMoves(arrayMoveList *__return_storage_ptr__,game *this)

{
  bitboards game;
  bool bVar1;
  bool bVar2;
  move mVar3;
  move local_3c4 [4];
  move local_3b8 [4];
  move local_3ac [4];
  move local_3a0 [3];
  byte bStack_395;
  move local_393;
  undefined8 uStack_390;
  move intermediate;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined1 local_318 [4];
  bool good;
  arrayMoveList moves;
  game *this_local;
  
  moves._768_8_ = this;
  generateSemilegalMoves((arrayMoveList *)local_318,this);
  arrayMoveList::arrayMoveList(__return_storage_ptr__);
  arrayMoveList::resetIterator((arrayMoveList *)local_318);
  while (bVar1 = arrayMoveList::next((arrayMoveList *)local_318), bVar1) {
    mVar3 = arrayMoveList::getMove((arrayMoveList *)local_318);
    if (mVar3.special == '\x01') {
      mVar3 = arrayMoveList::getMove((arrayMoveList *)local_318);
      makeMove(this,mVar3);
      bVar2 = isGameLegal(this);
      undoMove(this);
      bVar1 = this->blacksTurn;
      memcpy(&stack0xfffffffffffffc70,this,0x68);
      game.WN = uStack_388;
      game.WP = uStack_390;
      game.WB = local_380;
      game.WR = uStack_378;
      game.WQ = local_370;
      game.WK = uStack_368;
      game.BP = local_360;
      game.BN = uStack_358;
      game.BB = local_350;
      game.BR = uStack_348;
      game.BQ = local_340;
      game.BK = uStack_338;
      game._96_8_ = local_330;
      bVar1 = inCheck((bool)(bVar1 & 1),game);
      if (bVar1) {
        bVar2 = false;
      }
      move::move(&local_393);
      mVar3 = arrayMoveList::getMove((arrayMoveList *)local_318);
      bStack_395 = mVar3.end;
      if (bStack_395 == '\x02') {
        mVar3 = arrayMoveList::getMove((arrayMoveList *)local_318);
        local_393.end = '\x03';
        local_393.start = mVar3.start;
        local_3a0[0].special = local_393.special;
        local_3a0[0].start = mVar3.start;
        local_3a0[0].end = '\x03';
        makeMove(this,local_3a0[0]);
        bVar1 = isGameLegal(this);
        if (!bVar1) {
          bVar2 = false;
        }
        undoMove(this);
      }
      else if (bStack_395 == '\x06') {
        mVar3 = arrayMoveList::getMove((arrayMoveList *)local_318);
        local_393.end = '\x05';
        local_393.start = mVar3.start;
        local_3ac[0].special = local_393.special;
        local_3ac[0].start = mVar3.start;
        local_3ac[0].end = '\x05';
        makeMove(this,local_3ac[0]);
        bVar1 = isGameLegal(this);
        if (!bVar1) {
          bVar2 = false;
        }
        undoMove(this);
      }
      else if (bStack_395 == ':') {
        mVar3 = arrayMoveList::getMove((arrayMoveList *)local_318);
        local_393.end = ';';
        local_393.start = mVar3.start;
        local_3b8[0].special = local_393.special;
        local_3b8[0].start = mVar3.start;
        local_3b8[0].end = ';';
        makeMove(this,local_3b8[0]);
        bVar1 = isGameLegal(this);
        if (!bVar1) {
          bVar2 = false;
        }
        undoMove(this);
      }
      else if (bStack_395 == '>') {
        mVar3 = arrayMoveList::getMove((arrayMoveList *)local_318);
        local_393.end = '=';
        local_393.start = mVar3.start;
        local_3c4[0].special = local_393.special;
        local_3c4[0].start = mVar3.start;
        local_3c4[0].end = '=';
        makeMove(this,local_3c4[0]);
        bVar1 = isGameLegal(this);
        if (!bVar1) {
          bVar2 = false;
        }
        undoMove(this);
      }
      if (bVar2) {
        mVar3 = arrayMoveList::getMove((arrayMoveList *)local_318);
        arrayMoveList::add(__return_storage_ptr__,mVar3);
      }
    }
    else {
      mVar3 = arrayMoveList::getMove((arrayMoveList *)local_318);
      makeMove(this,mVar3);
      bVar1 = isGameLegal(this);
      if (bVar1) {
        mVar3 = arrayMoveList::getMove((arrayMoveList *)local_318);
        arrayMoveList::add(__return_storage_ptr__,mVar3);
      }
      undoMove(this);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

arrayMoveList game::generateLegalMoves() {
    arrayMoveList moves = generateSemilegalMoves();
    arrayMoveList returnedMoves;

    moves.resetIterator();
    while(moves.next()) {
        if(moves.getMove().special == 1) { // Are castling kings put in check en route?
            bool good = true;
            makeMove(moves.getMove());
            if(!isGameLegal()) good = false;
            undoMove();

            if(inCheck(blacksTurn, boards)) good = false;

            move intermediate;
            switch (moves.getMove().end) {
                case 2:
                    intermediate.start = moves.getMove().start;
                    intermediate.end = 3;
                    makeMove(intermediate);
                    if(!isGameLegal()) good = false;
                    undoMove();
                    break;
                case 6:
                    intermediate.start = moves.getMove().start;
                    intermediate.end = 5;
                    makeMove(intermediate);
                    if(!isGameLegal()) good = false;
                    undoMove();
                    break;
                case 58:
                    intermediate.start = moves.getMove().start;
                    intermediate.end = 59;
                    makeMove(intermediate);
                    if(!isGameLegal()) good = false;
                    undoMove();
                    break;
                case 62:
                    intermediate.start = moves.getMove().start;
                    intermediate.end = 61;
                    makeMove(intermediate);
                    if(!isGameLegal()) good = false;
                    undoMove();
                    break;
            }
            if(good) returnedMoves.add(moves.getMove());
        } else {
            makeMove(moves.getMove());
            if(isGameLegal()) returnedMoves.add(moves.getMove());
            undoMove();
        }
    }
    return returnedMoves;
}